

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O3

int lws_clean_url(char *p)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  
  pcVar5 = p;
  pcVar3 = p;
  if ((((*p == 'h') && (p[1] == 't')) && (p[2] == 't')) && (p[3] == 'p')) {
    pcVar2 = p + 4;
    if (p[4] == 's') {
      pcVar2 = p + 5;
    }
    pcVar5 = pcVar2;
    pcVar3 = pcVar2;
    if (p[(ulong)(p[4] == 's') + 4] == ':') {
      pcVar5 = pcVar2 + 1;
      pcVar3 = pcVar2 + 1;
      if (pcVar2[1] == '/') {
        pcVar5 = pcVar2 + 2;
        pcVar3 = pcVar2 + 2;
      }
    }
  }
LAB_0011efb8:
  do {
    pcVar2 = pcVar5;
    pcVar3 = pcVar3 + 1;
    pcVar5 = pcVar2 + 1;
    while (cVar1 = *pcVar2, cVar1 == '/') {
      pcVar4 = pcVar3;
      if (*pcVar5 != '/') goto LAB_0011efb8;
      do {
        cVar1 = *pcVar4;
        pcVar4[-1] = cVar1;
        pcVar4 = pcVar4 + 1;
      } while (cVar1 != '\0');
    }
    if (cVar1 == '\0') {
      return 0;
    }
  } while( true );
}

Assistant:

int lws_clean_url(char *p)
{
	if (p[0] == 'h' && p[1] == 't' && p[2] == 't' && p[3] == 'p') {
		p += 4;
		if (*p == 's')
		p++;
		if (*p == ':') {
			p++;
			if (*p == '/')
			p++;
		}
	}

	while (*p) {
		if (p[0] == '/' && p[1] == '/') {
			char *p1 = p;
			while (*p1) {
				*p1 = p1[1];
				p1++;
			}
			continue;
		}
		p++;
	}

	return 0;
}